

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_key_share.cc
# Opt level: O0

bool __thiscall
bssl::anon_unknown_0::X25519MLKEM768KeyShare::Decap
          (X25519MLKEM768KeyShare *this,Array<unsigned_char> *out_secret,uint8_t *out_alert,
          Span<const_unsigned_char> ciphertext)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *puVar4;
  uchar *puVar5;
  undefined1 local_48 [8];
  Array<unsigned_char> secret;
  uint8_t *out_alert_local;
  Array<unsigned_char> *out_secret_local;
  X25519MLKEM768KeyShare *this_local;
  Span<const_unsigned_char> ciphertext_local;
  
  ciphertext_local.data_ = (uchar *)ciphertext.size_;
  this_local = (X25519MLKEM768KeyShare *)ciphertext.data_;
  *out_alert = 'P';
  secret.size_ = (size_t)out_alert;
  Array<unsigned_char>::Array((Array<unsigned_char> *)local_48);
  bVar1 = Array<unsigned_char>::InitForOverwrite((Array<unsigned_char> *)local_48,0x40);
  if (bVar1) {
    sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&this_local);
    if (sVar3 == 0x460) {
      puVar4 = Array<unsigned_char>::data((Array<unsigned_char> *)local_48);
      puVar5 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&this_local);
      iVar2 = MLKEM768_decap(puVar4,puVar5,0x440,&this->mlkem_private_key_);
      if (iVar2 != 0) {
        puVar4 = Array<unsigned_char>::data((Array<unsigned_char> *)local_48);
        puVar5 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&this_local);
        iVar2 = X25519(puVar4 + 0x20,this->x25519_private_key_,puVar5 + 0x440);
        if (iVar2 != 0) {
          Array<unsigned_char>::operator=(out_secret,(Array<unsigned_char> *)local_48);
          ciphertext_local.size_._7_1_ = 1;
          goto LAB_001a3059;
        }
      }
    }
    *(undefined1 *)secret.size_ = 0x2f;
    ERR_put_error(0x10,0,0x6c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_key_share.cc"
                  ,0x16d);
    ciphertext_local.size_._7_1_ = 0;
  }
  else {
    ciphertext_local.size_._7_1_ = 0;
  }
LAB_001a3059:
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_48);
  return (bool)(ciphertext_local.size_._7_1_ & 1);
}

Assistant:

bool Decap(Array<uint8_t> *out_secret, uint8_t *out_alert,
             Span<const uint8_t> ciphertext) override {
    *out_alert = SSL_AD_INTERNAL_ERROR;

    Array<uint8_t> secret;
    if (!secret.InitForOverwrite(MLKEM_SHARED_SECRET_BYTES +
                                 X25519_SHARED_KEY_LEN)) {
      return false;
    }

    if (ciphertext.size() !=
            MLKEM768_CIPHERTEXT_BYTES + X25519_PUBLIC_VALUE_LEN ||
        !MLKEM768_decap(secret.data(), ciphertext.data(),
                        MLKEM768_CIPHERTEXT_BYTES, &mlkem_private_key_) ||
        !X25519(secret.data() + MLKEM_SHARED_SECRET_BYTES, x25519_private_key_,
                ciphertext.data() + MLKEM768_CIPHERTEXT_BYTES)) {
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_ECPOINT);
      return false;
    }

    *out_secret = std::move(secret);
    return true;
  }